

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateBreak(ExpressionEvalContext *ctx,ExprBreak *expression)

{
  StackFrame *pSVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  StackFrame *frame;
  ExprBreak *expression_local;
  ExpressionEvalContext *ctx_local;
  
  ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar2;
  if (pSVar1->targetYield == 0) {
    if (pSVar1->breakDepth != 0) {
      __assert_fail("frame->breakDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xbf1,"ExprBase *EvaluateBreak(ExpressionEvalContext &, ExprBreak *)");
    }
    pSVar1->breakDepth = *(uint *)&(expression->super_ExprBase).field_0x2c;
  }
  if ((expression->closures == (ExprBase *)0x0) ||
     (pEVar3 = Evaluate(ctx,expression->closures), pEVar3 != (ExprBase *)0x0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar3);
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateBreak(ExpressionEvalContext &ctx, ExprBreak *expression)
{
	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(!frame->targetYield)
	{
		assert(frame->breakDepth == 0);

		frame->breakDepth = expression->depth;
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}